

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

RPCHelpMan * getblocktemplate(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string cond;
  string cond_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  string m_key_name_17;
  string m_key_name_18;
  string m_key_name_19;
  string m_key_name_20;
  string m_key_name_21;
  string m_key_name_22;
  string m_key_name_23;
  string m_key_name_24;
  string m_key_name_25;
  string m_key_name_26;
  string m_key_name_27;
  string m_key_name_28;
  string m_key_name_29;
  string m_key_name_30;
  string m_key_name_31;
  string cond_01;
  string name_08;
  string m_key_name_32;
  string m_key_name_33;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  string description_31;
  string description_32;
  string description_33;
  string description_34;
  string m_key_name_34;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  Fallback fallback_03;
  Fallback fallback_04;
  Fallback fallback_05;
  Fallback fallback_06;
  Fallback fallback_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_31;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_32;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_33;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_34;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  string description_35;
  string description_36;
  string description_37;
  RPCResults results;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_35;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_36;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_37;
  RPCExamples examples;
  string description_38;
  string description_39;
  string description_40;
  string description_41;
  string description_42;
  string description_43;
  string description_44;
  string description_45;
  string description_46;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_38;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_39;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_40;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long *plVar8;
  RPCHelpMan *in_RDI;
  undefined8 uVar9;
  long lVar10;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  initializer_list<RPCResult> __l_06;
  initializer_list<RPCResult> __l_07;
  initializer_list<RPCResult> __l_08;
  initializer_list<RPCResult> __l_09;
  initializer_list<RPCResult> __l_10;
  initializer_list<RPCResult> __l_11;
  initializer_list<RPCResult> __l_12;
  undefined4 in_stack_ffffffffffffc8c8;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffc8cc;
  _Alloc_hider _Var12;
  undefined4 uVar13;
  undefined1 in_stack_ffffffffffffc8d0 [24];
  undefined8 in_stack_ffffffffffffc8f0;
  RPCArg *pRVar14;
  undefined8 in_stack_ffffffffffffc8f8;
  undefined8 in_stack_ffffffffffffc900;
  undefined8 in_stack_ffffffffffffc908;
  code *pcVar15;
  undefined8 in_stack_ffffffffffffc910;
  pointer in_stack_ffffffffffffc918;
  undefined8 in_stack_ffffffffffffc920;
  pointer in_stack_ffffffffffffc928;
  pointer pRVar16;
  pointer in_stack_ffffffffffffc930;
  pointer pRVar17;
  pointer in_stack_ffffffffffffc938;
  pointer pRVar18;
  undefined8 in_stack_ffffffffffffc940;
  pointer in_stack_ffffffffffffc948;
  pointer pRVar19;
  pointer in_stack_ffffffffffffc950;
  pointer pRVar20;
  pointer in_stack_ffffffffffffc958;
  undefined8 in_stack_ffffffffffffc960;
  pointer in_stack_ffffffffffffc968;
  pointer in_stack_ffffffffffffc970;
  pointer in_stack_ffffffffffffc978;
  undefined8 in_stack_ffffffffffffc980;
  pointer in_stack_ffffffffffffc988;
  pointer in_stack_ffffffffffffc990;
  pointer in_stack_ffffffffffffc998;
  undefined8 in_stack_ffffffffffffc9a0;
  pointer in_stack_ffffffffffffc9a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3638;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3618;
  vector<RPCResult,_std::allocator<RPCResult>_> local_35f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_35d8;
  allocator_type local_35b9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_35b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_35a0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3588;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3568;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3548;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3528;
  allocator_type local_3509;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3508;
  vector<RPCResult,_std::allocator<RPCResult>_> local_34e8;
  allocator_type local_34ca;
  allocator_type local_34c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_34c8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_34a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3488;
  allocator_type local_3469;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3468;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3450;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3438;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3418;
  vector<RPCResult,_std::allocator<RPCResult>_> local_33f8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_33d8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_33c0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_33a8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3388;
  allocator_type local_3369;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3368;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3348;
  allocator_type local_3329;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3328;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3308;
  allocator_type local_32e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_32e8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_32d0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_32b8;
  vector<RPCResult,_std::allocator<RPCResult>_> local_32a0;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3288;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3268;
  vector<RPCResult,_std::allocator<RPCResult>_> local_3248;
  allocator_type local_322b;
  allocator_type local_322a;
  allocator_type local_3229;
  vector<RPCArg,_std::allocator<RPCArg>_> local_3228;
  allocator_type local_3209;
  vector<RPCArg,_std::allocator<RPCArg>_> local_3208;
  vector<RPCArg,_std::allocator<RPCArg>_> local_31f0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_31d8;
  string local_31c0;
  string local_31a0;
  string local_3180;
  string local_3160;
  string local_3140;
  string local_3120;
  ulong *local_3100;
  undefined8 local_30f8;
  ulong local_30f0;
  undefined8 uStack_30e8;
  ulong *local_30e0;
  size_type local_30d8;
  ulong local_30d0;
  undefined8 uStack_30c8;
  long *local_30c0 [2];
  long local_30b0 [2];
  long *local_30a0 [2];
  long local_3090 [2];
  long *local_3080 [2];
  long local_3070 [2];
  long *local_3060 [2];
  long local_3050 [2];
  long *local_3040 [2];
  long local_3030 [2];
  long *local_3020 [2];
  long local_3010 [2];
  long *local_3000 [2];
  long local_2ff0 [2];
  long *local_2fe0 [2];
  long local_2fd0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2fc0;
  long *local_2fa0 [2];
  long local_2f90 [2];
  long *local_2f80 [2];
  long local_2f70 [2];
  long *local_2f60 [2];
  long local_2f50 [2];
  long *local_2f40 [2];
  long local_2f30 [2];
  long *local_2f20 [2];
  long local_2f10 [2];
  long *local_2f00 [2];
  long local_2ef0 [2];
  long *local_2ee0 [2];
  long local_2ed0 [2];
  long *local_2ec0 [2];
  long local_2eb0 [2];
  long *local_2ea0 [2];
  long local_2e90 [2];
  long *local_2e80 [2];
  long local_2e70 [2];
  long *local_2e60 [2];
  long local_2e50 [2];
  RPCResult local_2e40;
  long *local_2db8 [2];
  long local_2da8 [2];
  long *local_2d98 [2];
  long local_2d88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d78;
  long *local_2d58 [2];
  long local_2d48 [2];
  long *local_2d38 [2];
  long local_2d28 [2];
  long *local_2d18 [2];
  long local_2d08 [2];
  long *local_2cf8 [2];
  long local_2ce8 [2];
  long *local_2cd8 [2];
  long local_2cc8 [2];
  long *local_2cb8 [2];
  long local_2ca8 [2];
  long *local_2c98 [2];
  long local_2c88 [2];
  long *local_2c78 [2];
  long local_2c68 [2];
  long *local_2c58 [2];
  long local_2c48 [2];
  RPCResult local_2c38;
  long *local_2bb0 [2];
  long local_2ba0 [2];
  long *local_2b90 [2];
  long local_2b80 [2];
  long *local_2b70 [2];
  long local_2b60 [2];
  long *local_2b50 [2];
  long local_2b40 [2];
  long *local_2b30 [2];
  long local_2b20 [2];
  long *local_2b10 [2];
  long local_2b00 [2];
  long *local_2af0 [2];
  long local_2ae0 [2];
  long *local_2ad0 [2];
  long local_2ac0 [2];
  long *local_2ab0 [2];
  long local_2aa0 [2];
  long *local_2a90 [2];
  long local_2a80 [2];
  RPCResult local_2a70;
  long *local_29e8 [2];
  long local_29d8 [2];
  long *local_29c8 [2];
  long local_29b8 [2];
  long *local_29a8 [2];
  long local_2998 [2];
  long *local_2988 [2];
  long local_2978 [2];
  long *local_2968 [2];
  long local_2958 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_2948;
  long *local_2928 [2];
  long local_2918 [2];
  pointer local_2908 [2];
  undefined1 local_28f8 [152];
  RPCResult local_2860;
  RPCResult local_27d8;
  RPCResult local_2750;
  RPCResult local_26c8;
  RPCResult local_2640;
  RPCResult local_25b8;
  long *local_2530 [2];
  long local_2520 [2];
  long *local_2510 [2];
  long local_2500 [2];
  RPCResult local_24f0;
  long *local_2468 [2];
  long local_2458 [2];
  long *local_2448 [2];
  long local_2438 [2];
  long *local_2428 [2];
  long local_2418 [2];
  long *local_2408 [2];
  long local_23f8 [2];
  long *local_23e8 [2];
  long local_23d8 [2];
  long *local_23c8 [2];
  long local_23b8 [2];
  long *local_23a8 [2];
  long local_2398 [2];
  long *local_2388 [2];
  long local_2378 [2];
  RPCResult local_2368;
  long *local_22e0 [2];
  long local_22d0 [2];
  long *local_22c0 [2];
  long local_22b0 [2];
  long *local_22a0 [2];
  long local_2290 [2];
  long *local_2280 [2];
  long local_2270 [2];
  RPCResult local_2260;
  long *local_21d8 [2];
  long local_21c8 [2];
  long *local_21b8 [2];
  long local_21a8 [2];
  long *local_2198 [2];
  long local_2188 [2];
  long *local_2178 [2];
  long local_2168 [2];
  RPCResult local_2158;
  long *local_20d0 [2];
  long local_20c0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_20b0;
  long *local_2090 [2];
  long local_2080 [2];
  pointer local_2070 [2];
  undefined1 local_2060 [48];
  pointer local_2030;
  RPCResult local_1fc8;
  RPCResult local_1f40;
  RPCResult local_1eb8;
  RPCResult local_1e30;
  RPCResult local_1da8;
  RPCResult local_1d20;
  RPCResult local_1c98;
  RPCResult local_1c10;
  RPCResult local_1b88;
  RPCResult local_1b00;
  RPCResult local_1a78;
  RPCResult local_19f0;
  RPCResult local_1968;
  RPCResult local_18e0;
  RPCResult local_1858;
  RPCResult local_17d0;
  RPCResult local_1748;
  RPCResult local_16c0;
  RPCResult local_1638;
  RPCResult local_15b0;
  RPCResult local_1528;
  long *local_14a0 [2];
  long local_1490 [2];
  long *local_1480 [2];
  long local_1470 [2];
  long *local_1460 [2];
  long local_1450 [2];
  long *local_1440 [2];
  long local_1430 [2];
  long *local_1420 [2];
  long local_1410 [2];
  long *local_1400 [2];
  long local_13f0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_13e0;
  long *local_13c0 [2];
  long local_13b0 [2];
  long *local_13a0 [2];
  long local_1390 [2];
  RPCResult local_1380;
  RPCResult local_12f8;
  RPCResult local_1270;
  undefined1 local_11e8 [8];
  undefined1 *local_11e0;
  undefined8 local_11d8;
  undefined1 local_11d0;
  undefined7 uStack_11cf;
  undefined1 local_11c0 [32];
  undefined1 local_11a0;
  undefined1 *local_1198;
  undefined8 local_1190;
  undefined1 local_1188;
  undefined7 uStack_1187;
  undefined1 local_1178 [32];
  long *local_1158 [2];
  long local_1148 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1138;
  undefined1 local_10e0;
  long *local_10d8 [2];
  long local_10c8 [2];
  undefined1 local_10b8;
  undefined1 *local_10b0;
  undefined8 local_10a8;
  undefined1 local_10a0;
  undefined7 uStack_109f;
  undefined1 local_1090 [32];
  long *local_1070 [2];
  long local_1060 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1050;
  undefined1 local_ff8;
  long *local_ff0 [2];
  long local_fe0 [2];
  undefined1 local_fd0 [8];
  undefined1 *local_fc8;
  undefined8 local_fc0;
  undefined1 local_fb8;
  undefined7 uStack_fb7;
  undefined1 local_fa8 [32];
  undefined1 local_f88;
  undefined1 *local_f80;
  undefined8 local_f78;
  undefined1 local_f70;
  undefined7 uStack_f6f;
  undefined1 local_f60 [32];
  long *local_f40 [2];
  long local_f30 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_f20;
  undefined1 local_ec8;
  long *local_ec0 [2];
  long local_eb0 [2];
  undefined1 local_ea0;
  vector<RPCArg,_std::allocator<RPCArg>_> local_e98;
  undefined1 auStack_e80 [8];
  undefined1 local_e78 [32];
  long *local_e58 [2];
  long local_e48 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_e38;
  undefined1 local_de0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dd8;
  RPCArg local_db8;
  RPCArg local_cb0;
  long *local_ba8 [2];
  long local_b98 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_b88;
  undefined1 local_b30;
  long *local_b28 [2];
  long local_b18 [2];
  undefined1 local_b08 [8];
  undefined1 *local_b00;
  undefined8 local_af8;
  undefined1 local_af0;
  undefined7 uStack_aef;
  undefined1 local_ae0 [32];
  undefined1 local_ac0;
  undefined1 *local_ab8;
  undefined8 local_ab0;
  undefined1 local_aa8;
  undefined7 uStack_aa7;
  undefined1 local_a98 [32];
  long *local_a78 [2];
  long local_a68 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a58;
  undefined1 local_a00;
  long *local_9f8 [2];
  long local_9e8 [2];
  RPCArg local_9d8;
  long *local_8d0 [2];
  long local_8c0 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_8b0;
  undefined1 local_858;
  long *local_850 [2];
  long local_840 [2];
  undefined1 local_830;
  vector<RPCArg,_std::allocator<RPCArg>_> local_828;
  undefined1 auStack_810 [8];
  undefined1 local_808 [32];
  long *local_7e8 [2];
  long local_7d8 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7c8;
  undefined1 local_770;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_768;
  RPCArg local_748;
  RPCArg local_640;
  RPCArg local_538;
  RPCArg local_430;
  RPCArg local_328;
  long *local_220 [2];
  long local_210 [2];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_200;
  undefined1 local_1a8;
  long *local_1a0 [2];
  long local_190 [2];
  RPCArg local_180;
  long *local_78 [2];
  long local_68 [2];
  _Any_data local_58;
  _Manager_type local_48 [2];
  long local_38;
  
  local_1050._32_8_ = 0;
  local_2030 = (pointer)0x0;
  local_3030[0] = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_unused._M_object = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"getblocktemplate","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "\nIf the request parameters include a \'mode\' key, that is used to explicitly select between the default \'template\' request or a \'proposal\'.\nIt returns data needed to construct a block to work on.\nFor full specification, see BIPs 22, 23, 9, and 145:\n    https://github.com/bitcoin/bips/blob/master/bip-0022.mediawiki\n    https://github.com/bitcoin/bips/blob/master/bip-0023.mediawiki\n    https://github.com/bitcoin/bips/blob/master/bip-0009.mediawiki#getblocktemplate_changes\n    https://github.com/bitcoin/bips/blob/master/bip-0145.mediawiki\n"
             ,"");
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"template_request","");
  local_200._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_1a8 = 0;
  local_220[0] = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Format of the template","");
  local_768.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_768.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"mode","");
  local_7c8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_770 = 0;
  local_7e8[0] = local_7d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7e8,
             "This must be set to \"template\", \"proposal\" (see BIP 23), or omitted","");
  local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_830 = 0;
  local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_808._0_8_ = (pointer)0x0;
  local_808._8_2_ = 0;
  local_808._10_6_ = 0;
  local_808._16_2_ = 0;
  local_808._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffc8cc;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffc8c8;
  name._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffc8d0._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffc8f0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_38._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_38._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_38.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_38.field_2._8_8_ = in_stack_ffffffffffffc960;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc970;
  opts._0_8_ = in_stack_ffffffffffffc968;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffc978;
  opts.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffc980;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffc988;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc990;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffc998;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffc9a0;
  opts._64_8_ = in_stack_ffffffffffffc9a8;
  RPCArg::RPCArg(&local_748,name,(Type)&local_768,fallback,description_38,opts);
  local_850[0] = local_840;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_850,"capabilities","");
  local_8b0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_858 = 0;
  local_8d0[0] = local_8c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8d0,"A list of strings","");
  local_9f8[0] = local_9e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_9f8,"str","");
  local_a58._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_a00 = 0;
  local_a78[0] = local_a68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a78,
             "client side supported feature, \'longpoll\', \'coinbasevalue\', \'proposal\', \'serverlist\', \'workid\'"
             ,"");
  local_ab8 = &local_aa8;
  local_ac0 = 0;
  local_ab0 = 0;
  local_aa8 = 0;
  local_a98._0_8_ = (pointer)0x0;
  local_a98._8_2_ = 0;
  local_a98._10_6_ = 0;
  local_a98._16_2_ = 0;
  local_a98._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffc8cc;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffc8c8;
  name_00._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffc8f0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_39._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_39._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_39.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_39.field_2._8_8_ = in_stack_ffffffffffffc960;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc970;
  opts_00._0_8_ = in_stack_ffffffffffffc968;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffc978;
  opts_00.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffc980;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffc988;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc990;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffc998;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffc9a0;
  opts_00._64_8_ = in_stack_ffffffffffffc9a8;
  RPCArg::RPCArg(&local_9d8,name_00,(Type)local_9f8,fallback_00,description_39,opts_00);
  __l._M_len = 1;
  __l._M_array = &local_9d8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_3208,__l,&local_3209);
  local_b00 = &local_af0;
  local_b08[0] = 0;
  local_af8 = 0;
  local_af0 = 0;
  local_ae0._0_8_ = (pointer)0x0;
  local_ae0._8_2_ = 0;
  local_ae0._10_6_ = 0;
  local_ae0._16_2_ = 0;
  local_ae0._18_8_ = 0;
  _Var12._M_p = local_b08;
  name_01._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_01._M_dataplus._M_p = _Var12._M_p;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffc8f0;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_40._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_40._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_40.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_40.field_2._8_8_ = in_stack_ffffffffffffc960;
  inner_38.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffc970;
  inner_38.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffc968;
  inner_38.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffc978;
  RPCArg::RPCArg(&local_640,name_01,(Type)local_850,fallback_01,description_40,inner_38,
                 (RPCArgOptions *)0x1);
  local_b28[0] = local_b18;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b28,"rules","");
  local_b88._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_b30 = 0;
  local_ba8[0] = local_b98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ba8,"A list of strings","");
  local_dd8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_dd8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd8,"segwit","");
  local_e38._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_de0 = 0;
  local_e58[0] = local_e48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e58,"(literal) indicates client side segwit support","");
  local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((long)&local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl
                      + 0x10);
  local_ea0 = 0;
  local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_e78._0_8_ = (pointer)0x0;
  local_e78._8_2_ = 0;
  local_e78._10_6_ = 0;
  local_e78._16_2_ = 0;
  local_e78._18_8_ = 0;
  name_02._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_02._M_dataplus._M_p = _Var12._M_p;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffc8f0;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_41._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_41._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_41.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_41.field_2._8_8_ = in_stack_ffffffffffffc960;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc970;
  opts_01._0_8_ = in_stack_ffffffffffffc968;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffc978;
  opts_01.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffc980;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffc988;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc990;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffc998;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffc9a0;
  opts_01._64_8_ = in_stack_ffffffffffffc9a8;
  RPCArg::RPCArg(&local_db8,name_02,(Type)&local_dd8,fallback_02,description_41,opts_01);
  pRVar14 = &local_cb0;
  local_ec0[0] = local_eb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ec0,"str","");
  local_f20._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_ec8 = 0;
  local_f40[0] = local_f30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f40,"other client side supported softfork deployment","");
  local_f80 = &local_f70;
  local_f88 = 0;
  local_f78 = 0;
  local_f70 = 0;
  local_f60._0_8_ = (pointer)0x0;
  local_f60._8_2_ = 0;
  local_f60._10_6_ = 0;
  local_f60._16_2_ = 0;
  local_f60._18_8_ = 0;
  name_03._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_03._M_dataplus._M_p = _Var12._M_p;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = pRVar14;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_03.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_42._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_42._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_42.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_42.field_2._8_8_ = in_stack_ffffffffffffc960;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc970;
  opts_02._0_8_ = in_stack_ffffffffffffc968;
  opts_02.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffc978;
  opts_02.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffc980;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffc988;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc990;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffc998;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffc9a0;
  opts_02._64_8_ = in_stack_ffffffffffffc9a8;
  RPCArg::RPCArg(&local_cb0,name_03,(Type)local_ec0,fallback_03,description_42,opts_02);
  __l_00._M_len = 2;
  __l_00._M_array = &local_db8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_3228,__l_00,&local_3229);
  local_fc8 = &local_fb8;
  local_fd0[0] = 0;
  local_fc0 = 0;
  local_fb8 = 0;
  local_fa8._0_8_ = (pointer)0x0;
  local_fa8._8_2_ = 0;
  local_fa8._10_6_ = 0;
  local_fa8._16_2_ = 0;
  local_fa8._18_8_ = 0;
  _Var12._M_p = local_fd0;
  name_04._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_04._M_dataplus._M_p = _Var12._M_p;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = pRVar14;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_04.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_43._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_43._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_43.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_43.field_2._8_8_ = in_stack_ffffffffffffc960;
  inner_39.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffc970;
  inner_39.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffc968;
  inner_39.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffc978;
  RPCArg::RPCArg(&local_538,name_04,(Type)local_b28,fallback_04,description_43,inner_39,
                 (RPCArgOptions *)0x1);
  local_ff0[0] = local_fe0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ff0,"longpollid","");
  local_1050._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_ff8 = 0;
  local_1070[0] = local_1060;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1070,
             "delay processing request until the result would vary significantly from the \"longpollid\" of a prior template"
             ,"");
  local_10b0 = &local_10a0;
  local_10b8 = 0;
  local_10a8 = 0;
  local_10a0 = 0;
  local_1090._0_8_ = (pointer)0x0;
  local_1090._8_2_ = 0;
  local_1090._10_6_ = 0;
  local_1090._16_2_ = 0;
  local_1090._18_8_ = 0;
  name_05._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_05._M_dataplus._M_p = _Var12._M_p;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = pRVar14;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_05.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_44._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_44._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_44.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_44.field_2._8_8_ = in_stack_ffffffffffffc960;
  opts_03.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc970;
  opts_03._0_8_ = in_stack_ffffffffffffc968;
  opts_03.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffc978;
  opts_03.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffc980;
  opts_03.oneline_description.field_2._8_8_ = in_stack_ffffffffffffc988;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc990;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffc998;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffc9a0;
  opts_03._64_8_ = in_stack_ffffffffffffc9a8;
  RPCArg::RPCArg(&local_430,name_05,(Type)local_ff0,fallback_05,description_44,opts_03);
  local_10d8[0] = local_10c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_10d8,"data","");
  local_1138._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_10e0 = 0;
  local_1158[0] = local_1148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1158,
             "proposed block data to check, encoded in hexadecimal; valid only for mode=\"proposal\""
             ,"");
  local_1198 = &local_1188;
  local_11a0 = 0;
  local_1190 = 0;
  local_1188 = 0;
  local_1178._0_8_ = (pointer)0x0;
  local_1178._8_2_ = 0;
  local_1178._10_6_ = 0;
  local_1178._16_2_ = 0;
  local_1178._18_8_ = 0;
  name_06._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_06._M_dataplus._M_p = _Var12._M_p;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = pRVar14;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_06.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_45._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_45._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_45.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_45.field_2._8_8_ = in_stack_ffffffffffffc960;
  opts_04.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc970;
  opts_04._0_8_ = in_stack_ffffffffffffc968;
  opts_04.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffc978;
  opts_04.oneline_description.field_2._M_allocated_capacity = in_stack_ffffffffffffc980;
  opts_04.oneline_description.field_2._8_8_ = in_stack_ffffffffffffc988;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc990;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffc998;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffc9a0;
  opts_04._64_8_ = in_stack_ffffffffffffc9a8;
  RPCArg::RPCArg(&local_328,name_06,(Type)local_10d8,fallback_06,description_45,opts_04);
  __l_01._M_len = 5;
  __l_01._M_array = &local_748;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_31f0,__l_01,&local_322a);
  local_11e0 = &local_11d0;
  local_11e8[0] = 0;
  local_11d8 = 0;
  local_11d0 = 0;
  local_11c0._0_8_ = (pointer)0x0;
  local_11c0._8_2_ = 0;
  local_11c0._10_6_ = 0;
  local_11c0._16_2_ = 0;
  local_11c0._18_8_ = 0;
  _Var12._M_p = local_11e8;
  name_07._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_07._M_dataplus._M_p = _Var12._M_p;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = pRVar14;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_RDI;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffc8f8;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffc900;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_ffffffffffffc908;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_ffffffffffffc910;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffc918;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffc920;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffc928;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffc930;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffc938;
  fallback_07.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffc940;
  description_46._M_string_length = (size_type)in_stack_ffffffffffffc950;
  description_46._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc948;
  description_46.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc958;
  description_46.field_2._8_8_ = in_stack_ffffffffffffc960;
  inner_40.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffc970;
  inner_40.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffc968;
  inner_40.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffc978;
  RPCArg::RPCArg(&local_180,name_07,(Type)local_1a0,fallback_07,description_46,inner_40,
                 (RPCArgOptions *)0x0);
  __l_02._M_len = 1;
  __l_02._M_array = &local_180;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_31d8,__l_02,&local_322b);
  local_13a0[0] = local_1390;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_13a0,"If the proposal was accepted with mode==\'proposal\'","");
  local_13c0[0] = local_13b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_13c0,"");
  local_13e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_13e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_13e0,"");
  local_3268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3268.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  cond.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffc8d0._8_16_;
  cond._M_dataplus._M_p = _Var12._M_p;
  m_key_name_32._M_string_length = (size_type)pRVar14;
  m_key_name_32._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_32.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  m_key_name_32.field_2._8_8_ = in_stack_ffffffffffffc900;
  description_35._M_string_length = in_stack_ffffffffffffc910;
  description_35._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc908;
  description_35.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc918;
  description_35.field_2._8_8_ = in_stack_ffffffffffffc920;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffc930;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffc928;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffc938;
  RPCResult::RPCResult(&local_1380,cond,(Type)local_13a0,m_key_name_32,description_35,inner_35);
  local_1400[0] = local_13f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1400,"If the proposal was not accepted with mode==\'proposal\'","");
  local_1420[0] = local_1410;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1420,"");
  local_1440[0] = local_1430;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1440,"According to BIP22","");
  local_3288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3288.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cond_00._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  cond_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  cond_00._M_dataplus._M_p = _Var12._M_p;
  m_key_name_33._M_string_length = (size_type)pRVar14;
  m_key_name_33._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_33.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  m_key_name_33.field_2._8_8_ = in_stack_ffffffffffffc900;
  description_36._M_string_length = in_stack_ffffffffffffc910;
  description_36._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc908;
  description_36.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc918;
  description_36.field_2._8_8_ = in_stack_ffffffffffffc920;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffc930;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffc928;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffc938;
  RPCResult::RPCResult(&local_12f8,cond_00,(Type)local_1400,m_key_name_33,description_36,inner_36);
  local_1460[0] = local_1450;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1460,"Otherwise","");
  local_1480[0] = local_1470;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1480,"");
  local_14a0[0] = local_1490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14a0,"");
  local_2070[0] = (pointer)local_2060;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2070,"version","");
  local_2090[0] = local_2080;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2090,"The preferred block version","");
  local_32b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_32b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_32b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name._M_dataplus._M_p = _Var12._M_p;
  description._M_string_length = (size_type)pRVar14;
  description._M_dataplus._M_p = (pointer)in_RDI;
  description.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffc910;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffc908;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            ((RPCResult *)(local_2060 + 0x10),NUM,m_key_name,description,inner,SUB81(local_2070,0));
  local_20b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_20b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_20b0,"rules","");
  local_20d0[0] = local_20c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20d0,"specific block rules that are to be enforced","");
  local_2178[0] = local_2168;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2178,"");
  local_2198[0] = local_2188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2198,
             "name of a rule the client must understand to some extent; see BIP 9 for format","");
  local_32e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_32e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_32e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_00._M_dataplus._M_p = _Var12._M_p;
  description_00._M_string_length = (size_type)pRVar14;
  description_00._M_dataplus._M_p = (pointer)in_RDI;
  description_00.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_00.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2158,STR,m_key_name_00,description_00,inner_00,SUB81(local_2178,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_2158;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_32d0,__l_03,&local_32e9);
  m_key_name_01._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_01._M_dataplus._M_p = _Var12._M_p;
  description_01._M_string_length = (size_type)pRVar14;
  description_01._M_dataplus._M_p = (pointer)in_RDI;
  description_01.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_01.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1fc8,ARR,m_key_name_01,description_01,inner_01,SUB81(&local_20b0,0));
  local_21b8[0] = local_21a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_21b8,"vbavailable","");
  local_21d8[0] = local_21c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_21d8,
             "set of pending, supported versionbit (BIP 9) softfork deployments","");
  local_2280[0] = local_2270;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2280,"rulename","");
  local_22a0[0] = local_2290;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_22a0,
             "identifies the bit number as indicating acceptance and readiness for the named softfork rule"
             ,"");
  local_3328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3328.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_02._M_dataplus._M_p = _Var12._M_p;
  description_02._M_string_length = (size_type)pRVar14;
  description_02._M_dataplus._M_p = (pointer)in_RDI;
  description_02.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_02.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2260,NUM,m_key_name_02,description_02,inner_02,SUB81(local_2280,0));
  __l_04._M_len = 1;
  __l_04._M_array = &local_2260;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_3308,__l_04,&local_3329);
  m_key_name_03._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_03._M_dataplus._M_p = _Var12._M_p;
  description_03._M_string_length = (size_type)pRVar14;
  description_03._M_dataplus._M_p = (pointer)in_RDI;
  description_03.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_03.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_1f40,OBJ_DYN,m_key_name_03,description_03,inner_03,SUB81(local_21b8,0));
  local_22c0[0] = local_22b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22c0,"capabilities","");
  local_22e0[0] = local_22d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22e0,"");
  local_2388[0] = local_2378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2388,"value","");
  local_23a8[0] = local_2398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23a8,"A supported feature, for example \'proposal\'","");
  local_3368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3368.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_04._M_dataplus._M_p = _Var12._M_p;
  description_04._M_string_length = (size_type)pRVar14;
  description_04._M_dataplus._M_p = (pointer)in_RDI;
  description_04.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_04.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2368,STR,m_key_name_04,description_04,inner_04,SUB81(local_2388,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_2368;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_3348,__l_05,&local_3369);
  m_key_name_05._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_05._M_dataplus._M_p = _Var12._M_p;
  description_05._M_string_length = (size_type)pRVar14;
  description_05._M_dataplus._M_p = (pointer)in_RDI;
  description_05.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_05.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1eb8,ARR,m_key_name_05,description_05,inner_05,SUB81(local_22c0,0));
  local_23c8[0] = local_23b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_23c8,"vbrequired","");
  local_23e8[0] = local_23d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23e8,"bit mask of versionbits the server requires set in submissions",
             "");
  local_3388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3388.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_06._M_dataplus._M_p = _Var12._M_p;
  description_06._M_string_length = (size_type)pRVar14;
  description_06._M_dataplus._M_p = (pointer)in_RDI;
  description_06.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_06.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1e30,NUM,m_key_name_06,description_06,inner_06,SUB81(local_23c8,0));
  local_2408[0] = local_23f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2408,"previousblockhash","");
  local_2428[0] = local_2418;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2428,"The hash of current highest block","");
  local_33a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_33a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_33a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_07._M_dataplus._M_p = _Var12._M_p;
  description_07._M_string_length = (size_type)pRVar14;
  description_07._M_dataplus._M_p = (pointer)in_RDI;
  description_07.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_07.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1da8,STR,m_key_name_07,description_07,inner_07,SUB81(local_2408,0));
  local_2448[0] = local_2438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2448,"transactions","");
  local_2468[0] = local_2458;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2468,
             "contents of non-coinbase transactions that should be included in the next block","");
  local_2510[0] = local_2500;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2510,"");
  local_2530[0] = local_2520;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2530,"");
  local_2908[0] = (pointer)local_28f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2908,"data","");
  local_2928[0] = local_2918;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2928,"transaction data encoded in hexadecimal (byte-for-byte)","");
  local_33f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_33f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_33f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_08._M_dataplus._M_p = _Var12._M_p;
  description_08._M_string_length = (size_type)pRVar14;
  description_08._M_dataplus._M_p = (pointer)in_RDI;
  description_08.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_08.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            ((RPCResult *)(local_28f8 + 0x10),STR_HEX,m_key_name_08,description_08,inner_08,
             SUB81(local_2908,0));
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2948,"txid","");
  local_2968[0] = local_2958;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2968,"transaction id encoded in little-endian hexadecimal","");
  local_3418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3418.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_09.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_09._M_dataplus._M_p = _Var12._M_p;
  description_09._M_string_length = (size_type)pRVar14;
  description_09._M_dataplus._M_p = (pointer)in_RDI;
  description_09.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_09.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_2860,STR_HEX,m_key_name_09,description_09,inner_09,SUB81(&local_2948,0));
  local_2988[0] = local_2978;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2988,"hash","");
  local_29a8[0] = local_2998;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_29a8,
             "hash encoded in little-endian hexadecimal (including witness data)","");
  local_3438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3438.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_10.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_10._M_dataplus._M_p = _Var12._M_p;
  description_10._M_string_length = (size_type)pRVar14;
  description_10._M_dataplus._M_p = (pointer)in_RDI;
  description_10.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_10.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_27d8,STR_HEX,m_key_name_10,description_10,inner_10,SUB81(local_2988,0));
  local_29c8[0] = local_29b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_29c8,"depends","");
  local_29e8[0] = local_29d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_29e8,"array of numbers","");
  local_2a90[0] = local_2a80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a90,"");
  local_2ab0[0] = local_2aa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2ab0,
             "transactions before this one (by 1-based index in \'transactions\' list) that must be present in the final block if this one is"
             ,"");
  local_3468.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3468.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3468.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_11.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_11._M_dataplus._M_p = _Var12._M_p;
  description_11._M_string_length = (size_type)pRVar14;
  description_11._M_dataplus._M_p = (pointer)in_RDI;
  description_11.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_11.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2a70,NUM,m_key_name_11,description_11,inner_11,SUB81(local_2a90,0));
  __l_06._M_len = 1;
  __l_06._M_array = &local_2a70;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_3450,__l_06,&local_3469);
  m_key_name_12._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_12.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_12._M_dataplus._M_p = _Var12._M_p;
  description_12._M_string_length = (size_type)pRVar14;
  description_12._M_dataplus._M_p = (pointer)in_RDI;
  description_12.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_12.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2750,ARR,m_key_name_12,description_12,inner_12,SUB81(local_29c8,0));
  local_2ad0[0] = local_2ac0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2ad0,"fee","");
  local_2af0[0] = local_2ae0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2af0,
             "difference in value between transaction inputs and outputs (in satoshis); for coinbase transactions, this is a negative Number of the total collected block fees (ie, not including the block subsidy); if key is not present, fee is unknown and clients MUST NOT assume there isn\'t one"
             ,"");
  local_3488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3488.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_13.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_13._M_dataplus._M_p = _Var12._M_p;
  description_13._M_string_length = (size_type)pRVar14;
  description_13._M_dataplus._M_p = (pointer)in_RDI;
  description_13.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_13.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_26c8,NUM,m_key_name_13,description_13,inner_13,SUB81(local_2ad0,0));
  local_2b10[0] = local_2b00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b10,"sigops","");
  local_2b30[0] = local_2b20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b30,
             "total SigOps cost, as counted for purposes of block limits; if key is not present, sigop cost is unknown and clients MUST NOT assume it is zero"
             ,"");
  local_34a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_34a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_14._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_14.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_14._M_dataplus._M_p = _Var12._M_p;
  description_14._M_string_length = (size_type)pRVar14;
  description_14._M_dataplus._M_p = (pointer)in_RDI;
  description_14.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_14.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2640,NUM,m_key_name_14,description_14,inner_14,SUB81(local_2b10,0));
  local_2b50[0] = local_2b40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b50,"weight","");
  local_2b70[0] = local_2b60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b70,
             "total transaction weight, as counted for purposes of block limits","");
  local_34c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_34c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_15._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_15.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_15._M_dataplus._M_p = _Var12._M_p;
  description_15._M_string_length = (size_type)pRVar14;
  description_15._M_dataplus._M_p = (pointer)in_RDI;
  description_15.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_15.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_25b8,NUM,m_key_name_15,description_15,inner_15,SUB81(local_2b50,0));
  __l_07._M_len = 7;
  __l_07._M_array = (iterator)(local_28f8 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_33d8,__l_07,&local_34c9);
  m_key_name_16._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_16.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_16._M_dataplus._M_p = _Var12._M_p;
  description_16._M_string_length = (size_type)pRVar14;
  description_16._M_dataplus._M_p = (pointer)in_RDI;
  description_16.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_16.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_24f0,OBJ,m_key_name_16,description_16,inner_16,SUB81(local_2510,0));
  __l_08._M_len = 1;
  __l_08._M_array = &local_24f0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_33c0,__l_08,&local_34ca);
  m_key_name_17._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_17.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_17._M_dataplus._M_p = _Var12._M_p;
  description_17._M_string_length = (size_type)pRVar14;
  description_17._M_dataplus._M_p = (pointer)in_RDI;
  description_17.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_17.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1d20,ARR,m_key_name_17,description_17,inner_17,SUB81(local_2448,0));
  local_2b90[0] = local_2b80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b90,"coinbaseaux","");
  local_2bb0[0] = local_2ba0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2bb0,
             "data that should be included in the coinbase\'s scriptSig content","");
  local_2c58[0] = local_2c48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c58,"key","");
  local_2c78[0] = local_2c68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c78,"values must be in the coinbase (keys may be ignored)","");
  local_3508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3508.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_18._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_18.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_18._M_dataplus._M_p = _Var12._M_p;
  description_18._M_string_length = (size_type)pRVar14;
  description_18._M_dataplus._M_p = (pointer)in_RDI;
  description_18.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_18.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_2c38,STR_HEX,m_key_name_18,description_18,inner_18,SUB81(local_2c58,0));
  __l_09._M_len = 1;
  __l_09._M_array = &local_2c38;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_34e8,__l_09,&local_3509);
  m_key_name_19._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_19.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_19._M_dataplus._M_p = _Var12._M_p;
  description_19._M_string_length = (size_type)pRVar14;
  description_19._M_dataplus._M_p = (pointer)in_RDI;
  description_19.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_19.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_1c98,OBJ_DYN,m_key_name_19,description_19,inner_19,SUB81(local_2b90,0));
  local_2c98[0] = local_2c88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c98,"coinbasevalue","");
  local_2cb8[0] = local_2ca8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2cb8,
             "maximum allowable input to coinbase transaction, including the generation award and transaction fees (in satoshis)"
             ,"");
  local_3528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3528.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_20._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_20.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_20._M_dataplus._M_p = _Var12._M_p;
  description_20._M_string_length = (size_type)pRVar14;
  description_20._M_dataplus._M_p = (pointer)in_RDI;
  description_20.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_20.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1c10,NUM,m_key_name_20,description_20,inner_20,SUB81(local_2c98,0));
  local_2cd8[0] = local_2cc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2cd8,"longpollid","");
  local_2cf8[0] = local_2ce8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2cf8,
             "an id to include with a request to longpoll on an update to this template","");
  local_3548.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3548.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3548.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_21._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_21.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_21._M_dataplus._M_p = _Var12._M_p;
  description_21._M_string_length = (size_type)pRVar14;
  description_21._M_dataplus._M_p = (pointer)in_RDI;
  description_21.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_21.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1b88,STR,m_key_name_21,description_21,inner_21,SUB81(local_2cd8,0));
  local_2d18[0] = local_2d08;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d18,"target","");
  local_2d38[0] = local_2d28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d38,"The hash target","");
  local_3568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3568.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_22._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_22.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_22._M_dataplus._M_p = _Var12._M_p;
  description_22._M_string_length = (size_type)pRVar14;
  description_22._M_dataplus._M_p = (pointer)in_RDI;
  description_22.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_22.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1b00,STR,m_key_name_22,description_22,inner_22,SUB81(local_2d18,0));
  local_2d58[0] = local_2d48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d58,"mintime","");
  std::operator+(&local_2d78,
                 "The minimum timestamp appropriate for the next block time, expressed in ",
                 &UNIX_EPOCH_TIME_abi_cxx11_);
  local_3588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3588.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_23._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_23.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_23._M_dataplus._M_p = _Var12._M_p;
  description_23._M_string_length = (size_type)pRVar14;
  description_23._M_dataplus._M_p = (pointer)in_RDI;
  description_23.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_23.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_1a78,NUM_TIME,m_key_name_23,description_23,inner_23,SUB81(local_2d58,0));
  local_2d98[0] = local_2d88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d98,"mutable","");
  local_2db8[0] = local_2da8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2db8,"list of ways the block template may be changed","");
  local_2e60[0] = local_2e50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e60,"value","");
  local_2e80[0] = local_2e70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2e80,
             "A way the block template may be changed, e.g. \'time\', \'transactions\', \'prevblock\'"
             ,"");
  local_35b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_35b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_35b8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_24._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_24.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_24._M_dataplus._M_p = _Var12._M_p;
  description_24._M_string_length = (size_type)pRVar14;
  description_24._M_dataplus._M_p = (pointer)in_RDI;
  description_24.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_24.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_2e40,STR,m_key_name_24,description_24,inner_24,SUB81(local_2e60,0));
  __l_10._M_len = 1;
  __l_10._M_array = &local_2e40;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_35a0,__l_10,&local_35b9);
  m_key_name_25._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_25.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_25._M_dataplus._M_p = _Var12._M_p;
  description_25._M_string_length = (size_type)pRVar14;
  description_25._M_dataplus._M_p = (pointer)in_RDI;
  description_25.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_25.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_19f0,ARR,m_key_name_25,description_25,inner_25,SUB81(local_2d98,0));
  local_2ea0[0] = local_2e90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2ea0,"noncerange","");
  local_2ec0[0] = local_2eb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2ec0,"A range of valid nonces","")
  ;
  local_35d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_35d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_35d8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_26._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_26.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_26._M_dataplus._M_p = _Var12._M_p;
  description_26._M_string_length = (size_type)pRVar14;
  description_26._M_dataplus._M_p = (pointer)in_RDI;
  description_26.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_26.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_1968,STR_HEX,m_key_name_26,description_26,inner_26,SUB81(local_2ea0,0));
  local_2ee0[0] = local_2ed0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2ee0,"sigoplimit","");
  local_2f00[0] = local_2ef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2f00,"limit of sigops in blocks","");
  local_35f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_35f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_35f8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_27._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_27.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_27._M_dataplus._M_p = _Var12._M_p;
  description_27._M_string_length = (size_type)pRVar14;
  description_27._M_dataplus._M_p = (pointer)in_RDI;
  description_27.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_27.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_18e0,NUM,m_key_name_27,description_27,inner_27,SUB81(local_2ee0,0));
  local_2f20[0] = local_2f10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f20,"sizelimit","");
  local_2f40[0] = local_2f30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f40,"limit of block size","");
  local_3618.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3618.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3618.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_28._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_28.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_28._M_dataplus._M_p = _Var12._M_p;
  description_28._M_string_length = (size_type)pRVar14;
  description_28._M_dataplus._M_p = (pointer)in_RDI;
  description_28.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_28.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1858,NUM,m_key_name_28,description_28,inner_28,SUB81(local_2f20,0));
  local_2f60[0] = local_2f50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f60,"weightlimit","");
  uVar13 = (undefined4)((ulong)_Var12._M_p >> 0x20);
  local_2f80[0] = local_2f70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f80,"limit of block weight","");
  local_3638.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3638.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3638.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar11 = 0;
  auVar4._4_24_ = in_stack_ffffffffffffc8d0;
  auVar4._0_4_ = uVar13;
  auVar4._28_4_ = 0;
  description_29._M_string_length = (size_type)pRVar14;
  description_29._M_dataplus._M_p = (pointer)in_RDI;
  description_29.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_29.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_17d0,NUM,(string)(auVar4 << 0x20),SUB81(local_2f60,0),description_29,inner_29,
             true);
  local_2fa0[0] = local_2f90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2fa0,"curtime","");
  std::operator+(&local_2fc0,"current timestamp in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  m_key_name_29._M_dataplus._M_p._4_4_ = uVar13;
  m_key_name_29._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_29._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_29.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  description_30._M_string_length = (size_type)pRVar14;
  description_30._M_dataplus._M_p = (pointer)in_RDI;
  description_30.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_30.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_1748,NUM_TIME,m_key_name_29,description_30,inner_30,SUB81(local_2fa0,0));
  local_2fe0[0] = local_2fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2fe0,"bits","");
  local_3000[0] = local_2ff0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3000,"compressed target of next block","");
  m_key_name_30._M_dataplus._M_p._4_4_ = uVar13;
  m_key_name_30._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_30._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_30.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  description_31._M_string_length = (size_type)pRVar14;
  description_31._M_dataplus._M_p = (pointer)in_RDI;
  description_31.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_31.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_16c0,STR,m_key_name_30,description_31,inner_31,SUB81(local_2fe0,0));
  local_3020[0] = local_3010;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3020,"height","");
  local_3040[0] = local_3030;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3040,"The height of the next block","");
  m_key_name_31._M_dataplus._M_p._4_4_ = uVar13;
  m_key_name_31._M_dataplus._M_p._0_4_ = uVar11;
  m_key_name_31._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  m_key_name_31.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  description_32._M_string_length = (size_type)pRVar14;
  description_32._M_dataplus._M_p = (pointer)in_RDI;
  description_32.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_32.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult(&local_1638,NUM,m_key_name_31,description_32,inner_32,SUB81(local_3020,0));
  local_3060[0] = local_3050;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3060,"signet_challenge","");
  local_3080[0] = local_3070;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3080,"Only on signet","");
  pRVar19 = (pointer)0x0;
  pRVar20 = (pointer)0x0;
  auVar5._4_24_ = in_stack_ffffffffffffc8d0;
  auVar5._0_4_ = uVar13;
  auVar5._28_4_ = 0;
  description_33._M_string_length = (size_type)pRVar14;
  description_33._M_dataplus._M_p = (pointer)in_RDI;
  description_33.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_33.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_15b0,STR_HEX,(string)(auVar5 << 0x20),SUB81(local_3060,0),description_33,
             inner_33,true);
  local_30a0[0] = local_3090;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30a0,"default_witness_commitment","");
  local_30c0[0] = local_30b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30c0,"a valid witness commitment for the unmodified block template","")
  ;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  uVar11 = 0;
  auVar6._4_24_ = in_stack_ffffffffffffc8d0;
  auVar6._0_4_ = uVar13;
  auVar6._28_4_ = 0;
  description_34._M_string_length = (size_type)pRVar14;
  description_34._M_dataplus._M_p = (pointer)in_RDI;
  description_34.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  description_34.field_2._8_8_ = in_stack_ffffffffffffc900;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffc910;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffc908;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffc918;
  RPCResult::RPCResult
            (&local_1528,STR_HEX,(string)(auVar6 << 0x20),SUB81(local_30a0,0),description_34,
             inner_34,true);
  __l_11._M_len = 0x16;
  __l_11._M_array = (iterator)(local_2060 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_32a0,__l_11,(allocator_type *)&stack0xffffffffffffc927);
  cond_01._M_dataplus._M_p._4_4_ = uVar13;
  cond_01._M_dataplus._M_p._0_4_ = uVar11;
  cond_01._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  cond_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  m_key_name_34._M_string_length = (size_type)pRVar14;
  m_key_name_34._M_dataplus._M_p = (pointer)in_RDI;
  m_key_name_34.field_2._M_allocated_capacity = in_stack_ffffffffffffc8f8;
  m_key_name_34.field_2._8_8_ = in_stack_ffffffffffffc900;
  description_37._M_string_length = in_stack_ffffffffffffc910;
  description_37._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc908;
  description_37.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffc918;
  description_37.field_2._8_8_ = in_stack_ffffffffffffc920;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar17;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar16;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = pRVar18;
  RPCResult::RPCResult(&local_1270,cond_01,(Type)local_1460,m_key_name_34,description_37,inner_37);
  __l_12._M_len = 3;
  __l_12._M_array = &local_1380;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_3248,__l_12,(allocator_type *)&local_3120);
  local_3140._M_dataplus._M_p = (pointer)&local_3140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3140,"getblocktemplate","");
  local_3160._M_dataplus._M_p = (pointer)&local_3160.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3160,"\'{\"rules\": [\"segwit\"]}\'","");
  HelpExampleCli(&local_3120,&local_3140,&local_3160);
  local_31a0._M_dataplus._M_p = (pointer)&local_31a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_31a0,"getblocktemplate","");
  local_31c0._M_dataplus._M_p = (pointer)&local_31c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_31c0,"{\"rules\": [\"segwit\"]}","");
  HelpExampleRpc(&local_3180,&local_31a0,&local_31c0);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3120._M_dataplus._M_p != &local_3120.field_2) {
    uVar9 = local_3120.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_3180._M_string_length + local_3120._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3180._M_dataplus._M_p != &local_3180.field_2) {
      uVar9 = local_3180.field_2._M_allocated_capacity;
    }
    if (local_3180._M_string_length + local_3120._M_string_length <= (ulong)uVar9) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_3180,0,0,local_3120._M_dataplus._M_p,local_3120._M_string_length);
      goto LAB_00a0d8c7;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_3120,local_3180._M_dataplus._M_p,local_3180._M_string_length);
LAB_00a0d8c7:
  local_3100 = &local_30f0;
  puVar2 = (ulong *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_30f0 = paVar1->_M_allocated_capacity;
    uStack_30e8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_30f0 = paVar1->_M_allocated_capacity;
    local_3100 = puVar2;
  }
  local_30d8 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_3100 == &local_30f0) {
    uStack_30c8 = uStack_30e8;
    local_30e0 = &local_30d0;
  }
  else {
    local_30e0 = local_3100;
  }
  local_30d0 = local_30f0;
  local_30f8 = 0;
  local_30f0 = local_30f0 & 0xffffffffffffff00;
  pcVar15 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp:658:9)>
            ::_M_manager;
  name_08._M_string_length = in_stack_ffffffffffffc8d0._0_8_;
  name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffc8d0._8_16_;
  name_08._M_dataplus._M_p = &stack0xffffffffffffc8f8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp:658:9)>
                  ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)std::
                  _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/mining.cpp:658:9)>
                  ::_M_manager;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffc918;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffc920;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar17;
  examples.m_examples._M_string_length = in_stack_ffffffffffffc940;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar18;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar19;
  examples.m_examples.field_2._8_8_ = pRVar20;
  local_3100 = &local_30f0;
  RPCHelpMan::RPCHelpMan
            (in_RDI,name_08,(string)ZEXT1632(CONCAT88(pRVar14,in_RDI)),args,results,examples,
             (RPCMethodImpl *)&local_58);
  if (pcVar15 != (code *)0x0) {
    (*pcVar15)(&stack0xffffffffffffc8f8,&stack0xffffffffffffc8f8,3);
  }
  if (local_30e0 != &local_30d0) {
    operator_delete(local_30e0,local_30d0 + 1);
  }
  if (local_3100 != &local_30f0) {
    operator_delete(local_3100,local_30f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3180._M_dataplus._M_p != &local_3180.field_2) {
    operator_delete(local_3180._M_dataplus._M_p,local_3180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_31c0._M_dataplus._M_p != &local_31c0.field_2) {
    operator_delete(local_31c0._M_dataplus._M_p,local_31c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_31a0._M_dataplus._M_p != &local_31a0.field_2) {
    operator_delete(local_31a0._M_dataplus._M_p,local_31a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3120._M_dataplus._M_p != &local_3120.field_2) {
    operator_delete(local_3120._M_dataplus._M_p,local_3120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3160._M_dataplus._M_p != &local_3160.field_2) {
    operator_delete(local_3160._M_dataplus._M_p,local_3160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3140._M_dataplus._M_p != &local_3140.field_2) {
    operator_delete(local_3140._M_dataplus._M_p,local_3140.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3248);
  lVar10 = 0x198;
  do {
    if ((long *)((long)local_1390 + lVar10) != *(long **)((long)local_13a0 + lVar10)) {
      operator_delete(*(long **)((long)local_13a0 + lVar10),*(long *)((long)local_1390 + lVar10) + 1
                     );
    }
    if ((long *)((long)local_13b0 + lVar10) != *(long **)((long)local_13c0 + lVar10)) {
      operator_delete(*(long **)((long)local_13c0 + lVar10),*(long *)((long)local_13b0 + lVar10) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_13e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar10));
    if ((long *)((long)local_13f0 + lVar10) != *(long **)((long)local_1400 + lVar10)) {
      operator_delete(*(long **)((long)local_1400 + lVar10),*(long *)((long)local_13f0 + lVar10) + 1
                     );
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_32a0);
  lVar10 = 0xbb0;
  do {
    if ((long *)(local_2060 + lVar10) != *(long **)((long)local_2070 + lVar10)) {
      operator_delete(*(long **)((long)local_2070 + lVar10),*(long *)(local_2060 + lVar10) + 1);
    }
    if ((long *)((long)local_2080 + lVar10) != *(long **)((long)local_2090 + lVar10)) {
      operator_delete(*(long **)((long)local_2090 + lVar10),*(long *)((long)local_2080 + lVar10) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_20b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar10));
    if ((long *)((long)local_20c0 + lVar10) != *(long **)((long)local_20d0 + lVar10)) {
      operator_delete(*(long **)((long)local_20d0 + lVar10),*(long *)((long)local_20c0 + lVar10) + 1
                     );
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffc928);
  if (local_30c0[0] != local_30b0) {
    operator_delete(local_30c0[0],local_30b0[0] + 1);
  }
  if (local_30a0[0] != local_3090) {
    operator_delete(local_30a0[0],local_3090[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffc948);
  if (local_3080[0] != local_3070) {
    operator_delete(local_3080[0],local_3070[0] + 1);
  }
  if (local_3060[0] != local_3050) {
    operator_delete(local_3060[0],local_3050[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffc968);
  if (local_3040[0] != local_3030) {
    operator_delete(local_3040[0],local_3030[0] + 1);
  }
  if (local_3020[0] != local_3010) {
    operator_delete(local_3020[0],local_3010[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffc988);
  if (local_3000[0] != local_2ff0) {
    operator_delete(local_3000[0],local_2ff0[0] + 1);
  }
  if (local_2fe0[0] != local_2fd0) {
    operator_delete(local_2fe0[0],local_2fd0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffc9a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2fc0._M_dataplus._M_p != &local_2fc0.field_2) {
    operator_delete(local_2fc0._M_dataplus._M_p,local_2fc0.field_2._M_allocated_capacity + 1);
  }
  if (local_2fa0[0] != local_2f90) {
    operator_delete(local_2fa0[0],local_2f90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3638);
  if (local_2f80[0] != local_2f70) {
    operator_delete(local_2f80[0],local_2f70[0] + 1);
  }
  if (local_2f60[0] != local_2f50) {
    operator_delete(local_2f60[0],local_2f50[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3618);
  if (local_2f40[0] != local_2f30) {
    operator_delete(local_2f40[0],local_2f30[0] + 1);
  }
  if (local_2f20[0] != local_2f10) {
    operator_delete(local_2f20[0],local_2f10[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_35f8);
  if (local_2f00[0] != local_2ef0) {
    operator_delete(local_2f00[0],local_2ef0[0] + 1);
  }
  if (local_2ee0[0] != local_2ed0) {
    operator_delete(local_2ee0[0],local_2ed0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_35d8);
  if (local_2ec0[0] != local_2eb0) {
    operator_delete(local_2ec0[0],local_2eb0[0] + 1);
  }
  if (local_2ea0[0] != local_2e90) {
    operator_delete(local_2ea0[0],local_2e90[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_35a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e40.m_cond._M_dataplus._M_p != &local_2e40.m_cond.field_2) {
    operator_delete(local_2e40.m_cond._M_dataplus._M_p,
                    local_2e40.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e40.m_description._M_dataplus._M_p != &local_2e40.m_description.field_2) {
    operator_delete(local_2e40.m_description._M_dataplus._M_p,
                    local_2e40.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2e40.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e40.m_key_name._M_dataplus._M_p != &local_2e40.m_key_name.field_2) {
    operator_delete(local_2e40.m_key_name._M_dataplus._M_p,
                    local_2e40.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_35b8);
  if (local_2e80[0] != local_2e70) {
    operator_delete(local_2e80[0],local_2e70[0] + 1);
  }
  if (local_2e60[0] != local_2e50) {
    operator_delete(local_2e60[0],local_2e50[0] + 1);
  }
  if (local_2db8[0] != local_2da8) {
    operator_delete(local_2db8[0],local_2da8[0] + 1);
  }
  if (local_2d98[0] != local_2d88) {
    operator_delete(local_2d98[0],local_2d88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d78._M_dataplus._M_p != &local_2d78.field_2) {
    operator_delete(local_2d78._M_dataplus._M_p,local_2d78.field_2._M_allocated_capacity + 1);
  }
  if (local_2d58[0] != local_2d48) {
    operator_delete(local_2d58[0],local_2d48[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3568);
  if (local_2d38[0] != local_2d28) {
    operator_delete(local_2d38[0],local_2d28[0] + 1);
  }
  if (local_2d18[0] != local_2d08) {
    operator_delete(local_2d18[0],local_2d08[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3548);
  if (local_2cf8[0] != local_2ce8) {
    operator_delete(local_2cf8[0],local_2ce8[0] + 1);
  }
  if (local_2cd8[0] != local_2cc8) {
    operator_delete(local_2cd8[0],local_2cc8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3528);
  if (local_2cb8[0] != local_2ca8) {
    operator_delete(local_2cb8[0],local_2ca8[0] + 1);
  }
  if (local_2c98[0] != local_2c88) {
    operator_delete(local_2c98[0],local_2c88[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_34e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c38.m_cond._M_dataplus._M_p != &local_2c38.m_cond.field_2) {
    operator_delete(local_2c38.m_cond._M_dataplus._M_p,
                    local_2c38.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c38.m_description._M_dataplus._M_p != &local_2c38.m_description.field_2) {
    operator_delete(local_2c38.m_description._M_dataplus._M_p,
                    local_2c38.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c38.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c38.m_key_name._M_dataplus._M_p != &local_2c38.m_key_name.field_2) {
    operator_delete(local_2c38.m_key_name._M_dataplus._M_p,
                    local_2c38.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3508);
  if (local_2c78[0] != local_2c68) {
    operator_delete(local_2c78[0],local_2c68[0] + 1);
  }
  if (local_2c58[0] != local_2c48) {
    operator_delete(local_2c58[0],local_2c48[0] + 1);
  }
  if (local_2bb0[0] != local_2ba0) {
    operator_delete(local_2bb0[0],local_2ba0[0] + 1);
  }
  if (local_2b90[0] != local_2b80) {
    operator_delete(local_2b90[0],local_2b80[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_33c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24f0.m_cond._M_dataplus._M_p != &local_24f0.m_cond.field_2) {
    operator_delete(local_24f0.m_cond._M_dataplus._M_p,
                    local_24f0.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24f0.m_description._M_dataplus._M_p != &local_24f0.m_description.field_2) {
    operator_delete(local_24f0.m_description._M_dataplus._M_p,
                    local_24f0.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_24f0.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_24f0.m_key_name._M_dataplus._M_p != &local_24f0.m_key_name.field_2) {
    operator_delete(local_24f0.m_key_name._M_dataplus._M_p,
                    local_24f0.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_33d8);
  lVar10 = 0x3b8;
  do {
    if ((long *)(local_28f8 + lVar10) != *(long **)((long)local_2908 + lVar10)) {
      operator_delete(*(long **)((long)local_2908 + lVar10),*(long *)(local_28f8 + lVar10) + 1);
    }
    if ((long *)((long)local_2918 + lVar10) != *(long **)((long)local_2928 + lVar10)) {
      operator_delete(*(long **)((long)local_2928 + lVar10),*(long *)((long)local_2918 + lVar10) + 1
                     );
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + lVar10));
    if ((long *)((long)local_2958 + lVar10) != *(long **)((long)local_2968 + lVar10)) {
      operator_delete(*(long **)((long)local_2968 + lVar10),*(long *)((long)local_2958 + lVar10) + 1
                     );
    }
    lVar10 = lVar10 + -0x88;
  } while (lVar10 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_34c8);
  if (local_2b70[0] != local_2b60) {
    operator_delete(local_2b70[0],local_2b60[0] + 1);
  }
  if (local_2b50[0] != local_2b40) {
    operator_delete(local_2b50[0],local_2b40[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_34a8);
  if (local_2b30[0] != local_2b20) {
    operator_delete(local_2b30[0],local_2b20[0] + 1);
  }
  if (local_2b10[0] != local_2b00) {
    operator_delete(local_2b10[0],local_2b00[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3488);
  if (local_2af0[0] != local_2ae0) {
    operator_delete(local_2af0[0],local_2ae0[0] + 1);
  }
  if (local_2ad0[0] != local_2ac0) {
    operator_delete(local_2ad0[0],local_2ac0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3450);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a70.m_cond._M_dataplus._M_p != &local_2a70.m_cond.field_2) {
    operator_delete(local_2a70.m_cond._M_dataplus._M_p,
                    local_2a70.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a70.m_description._M_dataplus._M_p != &local_2a70.m_description.field_2) {
    operator_delete(local_2a70.m_description._M_dataplus._M_p,
                    local_2a70.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a70.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a70.m_key_name._M_dataplus._M_p != &local_2a70.m_key_name.field_2) {
    operator_delete(local_2a70.m_key_name._M_dataplus._M_p,
                    local_2a70.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3468);
  if (local_2ab0[0] != local_2aa0) {
    operator_delete(local_2ab0[0],local_2aa0[0] + 1);
  }
  if (local_2a90[0] != local_2a80) {
    operator_delete(local_2a90[0],local_2a80[0] + 1);
  }
  if (local_29e8[0] != local_29d8) {
    operator_delete(local_29e8[0],local_29d8[0] + 1);
  }
  if (local_29c8[0] != local_29b8) {
    operator_delete(local_29c8[0],local_29b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3438);
  if (local_29a8[0] != local_2998) {
    operator_delete(local_29a8[0],local_2998[0] + 1);
  }
  if (local_2988[0] != local_2978) {
    operator_delete(local_2988[0],local_2978[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3418);
  if (local_2968[0] != local_2958) {
    operator_delete(local_2968[0],local_2958[0] + 1);
  }
  if (local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_2948.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_33f8);
  if (local_2928[0] != local_2918) {
    operator_delete(local_2928[0],local_2918[0] + 1);
  }
  if (local_2908[0] != (pointer)local_28f8) {
    operator_delete(local_2908[0],local_28f8._0_8_ + 1);
  }
  if (local_2530[0] != local_2520) {
    operator_delete(local_2530[0],local_2520[0] + 1);
  }
  if (local_2510[0] != local_2500) {
    operator_delete(local_2510[0],local_2500[0] + 1);
  }
  if (local_2468[0] != local_2458) {
    operator_delete(local_2468[0],local_2458[0] + 1);
  }
  if (local_2448[0] != local_2438) {
    operator_delete(local_2448[0],local_2438[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_33a8);
  if (local_2428[0] != local_2418) {
    operator_delete(local_2428[0],local_2418[0] + 1);
  }
  if (local_2408[0] != local_23f8) {
    operator_delete(local_2408[0],local_23f8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3388);
  if (local_23e8[0] != local_23d8) {
    operator_delete(local_23e8[0],local_23d8[0] + 1);
  }
  if (local_23c8[0] != local_23b8) {
    operator_delete(local_23c8[0],local_23b8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368.m_cond._M_dataplus._M_p != &local_2368.m_cond.field_2) {
    operator_delete(local_2368.m_cond._M_dataplus._M_p,
                    local_2368.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368.m_description._M_dataplus._M_p != &local_2368.m_description.field_2) {
    operator_delete(local_2368.m_description._M_dataplus._M_p,
                    local_2368.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2368.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2368.m_key_name._M_dataplus._M_p != &local_2368.m_key_name.field_2) {
    operator_delete(local_2368.m_key_name._M_dataplus._M_p,
                    local_2368.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3368);
  if (local_23a8[0] != local_2398) {
    operator_delete(local_23a8[0],local_2398[0] + 1);
  }
  if (local_2388[0] != local_2378) {
    operator_delete(local_2388[0],local_2378[0] + 1);
  }
  if (local_22e0[0] != local_22d0) {
    operator_delete(local_22e0[0],local_22d0[0] + 1);
  }
  if (local_22c0[0] != local_22b0) {
    operator_delete(local_22c0[0],local_22b0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2260.m_cond._M_dataplus._M_p != &local_2260.m_cond.field_2) {
    operator_delete(local_2260.m_cond._M_dataplus._M_p,
                    local_2260.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2260.m_description._M_dataplus._M_p != &local_2260.m_description.field_2) {
    operator_delete(local_2260.m_description._M_dataplus._M_p,
                    local_2260.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2260.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2260.m_key_name._M_dataplus._M_p != &local_2260.m_key_name.field_2) {
    operator_delete(local_2260.m_key_name._M_dataplus._M_p,
                    local_2260.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3328);
  if (local_22a0[0] != local_2290) {
    operator_delete(local_22a0[0],local_2290[0] + 1);
  }
  if (local_2280[0] != local_2270) {
    operator_delete(local_2280[0],local_2270[0] + 1);
  }
  if (local_21d8[0] != local_21c8) {
    operator_delete(local_21d8[0],local_21c8[0] + 1);
  }
  if (local_21b8[0] != local_21a8) {
    operator_delete(local_21b8[0],local_21a8[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_32d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2158.m_cond._M_dataplus._M_p != &local_2158.m_cond.field_2) {
    operator_delete(local_2158.m_cond._M_dataplus._M_p,
                    local_2158.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2158.m_description._M_dataplus._M_p != &local_2158.m_description.field_2) {
    operator_delete(local_2158.m_description._M_dataplus._M_p,
                    local_2158.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2158.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2158.m_key_name._M_dataplus._M_p != &local_2158.m_key_name.field_2) {
    operator_delete(local_2158.m_key_name._M_dataplus._M_p,
                    local_2158.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_32e8);
  if (local_2198[0] != local_2188) {
    operator_delete(local_2198[0],local_2188[0] + 1);
  }
  if (local_2178[0] != local_2168) {
    operator_delete(local_2178[0],local_2168[0] + 1);
  }
  if (local_20d0[0] != local_20c0) {
    operator_delete(local_20d0[0],local_20c0[0] + 1);
  }
  if (local_20b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_20b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_20b0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_20b0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_32b8);
  if (local_2090[0] != local_2080) {
    operator_delete(local_2090[0],local_2080[0] + 1);
  }
  if (local_2070[0] != (pointer)local_2060) {
    operator_delete(local_2070[0],local_2060._0_8_ + 1);
  }
  if (local_14a0[0] != local_1490) {
    operator_delete(local_14a0[0],local_1490[0] + 1);
  }
  if (local_1480[0] != local_1470) {
    operator_delete(local_1480[0],local_1470[0] + 1);
  }
  if (local_1460[0] != local_1450) {
    operator_delete(local_1460[0],local_1450[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3288);
  if (local_1440[0] != local_1430) {
    operator_delete(local_1440[0],local_1430[0] + 1);
  }
  if (local_1420[0] != local_1410) {
    operator_delete(local_1420[0],local_1410[0] + 1);
  }
  if (local_1400[0] != local_13f0) {
    operator_delete(local_1400[0],local_13f0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_3268);
  if (local_13e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_13e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
               + 0x10U)) {
    operator_delete(local_13e0.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_13e0.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  if (local_13c0[0] != local_13b0) {
    operator_delete(local_13c0[0],local_13b0[0] + 1);
  }
  if (local_13a0[0] != local_1390) {
    operator_delete(local_13a0[0],local_1390[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_31d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_opts.oneline_description._M_dataplus._M_p !=
      &local_180.m_opts.oneline_description.field_2) {
    operator_delete(local_180.m_opts.oneline_description._M_dataplus._M_p,
                    local_180.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_description._M_dataplus._M_p != &local_180.m_description.field_2) {
    operator_delete(local_180.m_description._M_dataplus._M_p,
                    local_180.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_180.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_180.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_names._M_dataplus._M_p != &local_180.m_names.field_2) {
    operator_delete(local_180.m_names._M_dataplus._M_p,
                    local_180.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_11c0);
  if (local_11e0 != &local_11d0) {
    operator_delete(local_11e0,CONCAT71(uStack_11cf,local_11d0) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_31f0);
  lVar10 = 0x528;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_768.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar10));
    plVar3 = *(long **)((long)&local_7c8 + lVar10 + 0x40);
    plVar8 = (long *)((long)&local_7c8 + lVar10 + 0x50);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    plVar8 = (long *)((long)&local_7c8 + lVar10 + 0x28);
    plVar3 = *(long **)((long)&local_7c8 + lVar10 + 0x18);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_810 + lVar10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar10));
    if ((long *)((long)local_840 + lVar10) != *(long **)((long)local_850 + lVar10)) {
      operator_delete(*(long **)((long)local_850 + lVar10),*(long *)((long)local_840 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x108;
  } while (lVar10 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1178);
  if (local_1198 != &local_1188) {
    operator_delete(local_1198,CONCAT71(uStack_1187,local_1188) + 1);
  }
  if (local_1158[0] != local_1148) {
    operator_delete(local_1158[0],local_1148[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1138._M_first);
  if (local_10d8[0] != local_10c8) {
    operator_delete(local_10d8[0],local_10c8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1090);
  if (local_10b0 != &local_10a0) {
    operator_delete(local_10b0,CONCAT71(uStack_109f,local_10a0) + 1);
  }
  if (local_1070[0] != local_1060) {
    operator_delete(local_1070[0],local_1060[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1050._M_first);
  if (local_ff0[0] != local_fe0) {
    operator_delete(local_ff0[0],local_fe0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_fa8);
  if (local_fc8 != &local_fb8) {
    operator_delete(local_fc8,CONCAT71(uStack_fb7,local_fb8) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_3228);
  lVar10 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_dd8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar10));
    plVar3 = *(long **)((long)&local_e38 + lVar10 + 0x40);
    plVar8 = (long *)((long)&local_e38 + lVar10 + 0x50);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    plVar8 = (long *)((long)&local_e38 + lVar10 + 0x28);
    plVar3 = *(long **)((long)&local_e38 + lVar10 + 0x18);
    if (plVar8 != plVar3) {
      operator_delete(plVar3,*plVar8 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_e80 + lVar10));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar10));
    if ((long *)((long)local_eb0 + lVar10) != *(long **)((long)local_ec0 + lVar10)) {
      operator_delete(*(long **)((long)local_ec0 + lVar10),*(long *)((long)local_eb0 + lVar10) + 1);
    }
    lVar10 = lVar10 + -0x108;
  } while (lVar10 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f60);
  if (local_f80 != &local_f70) {
    operator_delete(local_f80,CONCAT71(uStack_f6f,local_f70) + 1);
  }
  if (local_f40[0] != local_f30) {
    operator_delete(local_f40[0],local_f30[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_f20._M_first);
  if (local_ec0[0] != local_eb0) {
    operator_delete(local_ec0[0],local_eb0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_e78);
  if (local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_e98.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_e58[0] != local_e48) {
    operator_delete(local_e58[0],local_e48[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_e38._M_first);
  if (local_dd8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_dd8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_dd8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_dd8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_ba8[0] != local_b98) {
    operator_delete(local_ba8[0],local_b98[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_b88._M_first);
  if (local_b28[0] != local_b18) {
    operator_delete(local_b28[0],local_b18[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_ae0);
  if (local_b00 != &local_af0) {
    operator_delete(local_b00,CONCAT71(uStack_aef,local_af0) + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_3208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_9d8.m_opts.type_str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8.m_opts.oneline_description._M_dataplus._M_p !=
      &local_9d8.m_opts.oneline_description.field_2) {
    operator_delete(local_9d8.m_opts.oneline_description._M_dataplus._M_p,
                    local_9d8.m_opts.oneline_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8.m_description._M_dataplus._M_p != &local_9d8.m_description.field_2) {
    operator_delete(local_9d8.m_description._M_dataplus._M_p,
                    local_9d8.m_description.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_9d8.m_fallback);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_9d8.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8.m_names._M_dataplus._M_p != &local_9d8.m_names.field_2) {
    operator_delete(local_9d8.m_names._M_dataplus._M_p,
                    local_9d8.m_names.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a98);
  if (local_ab8 != &local_aa8) {
    operator_delete(local_ab8,CONCAT71(uStack_aa7,local_aa8) + 1);
  }
  if (local_a78[0] != local_a68) {
    operator_delete(local_a78[0],local_a68[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a58._M_first);
  if (local_9f8[0] != local_9e8) {
    operator_delete(local_9f8[0],local_9e8[0] + 1);
  }
  if (local_8d0[0] != local_8c0) {
    operator_delete(local_8d0[0],local_8c0[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_8b0._M_first);
  if (local_850[0] != local_840) {
    operator_delete(local_850[0],local_840[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_808);
  if (local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (pointer)((long)&local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10U
               )) {
    operator_delete(local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_828.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if (local_7e8[0] != local_7d8) {
    operator_delete(local_7e8[0],local_7d8[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7c8._M_first);
  if (local_768.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_768.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_768.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_768.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_220[0] != local_210) {
    operator_delete(local_220[0],local_210[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_200._M_first);
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if ((_Manager_type *)local_58._M_unused._0_8_ != local_48) {
    operator_delete(local_58._M_unused._M_object,(ulong)(local_48[0] + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblocktemplate()
{
    return RPCHelpMan{"getblocktemplate",
        "\nIf the request parameters include a 'mode' key, that is used to explicitly select between the default 'template' request or a 'proposal'.\n"
        "It returns data needed to construct a block to work on.\n"
        "For full specification, see BIPs 22, 23, 9, and 145:\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0022.mediawiki\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0023.mediawiki\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0009.mediawiki#getblocktemplate_changes\n"
        "    https://github.com/bitcoin/bips/blob/master/bip-0145.mediawiki\n",
        {
            {"template_request", RPCArg::Type::OBJ, RPCArg::Optional::NO, "Format of the template",
            {
                {"mode", RPCArg::Type::STR, /* treat as named arg */ RPCArg::Optional::OMITTED, "This must be set to \"template\", \"proposal\" (see BIP 23), or omitted"},
                {"capabilities", RPCArg::Type::ARR, /* treat as named arg */ RPCArg::Optional::OMITTED, "A list of strings",
                {
                    {"str", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "client side supported feature, 'longpoll', 'coinbasevalue', 'proposal', 'serverlist', 'workid'"},
                }},
                {"rules", RPCArg::Type::ARR, RPCArg::Optional::NO, "A list of strings",
                {
                    {"segwit", RPCArg::Type::STR, RPCArg::Optional::NO, "(literal) indicates client side segwit support"},
                    {"str", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "other client side supported softfork deployment"},
                }},
                {"longpollid", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "delay processing request until the result would vary significantly from the \"longpollid\" of a prior template"},
                {"data", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "proposed block data to check, encoded in hexadecimal; valid only for mode=\"proposal\""},
            },
            },
        },
        {
            RPCResult{"If the proposal was accepted with mode=='proposal'", RPCResult::Type::NONE, "", ""},
            RPCResult{"If the proposal was not accepted with mode=='proposal'", RPCResult::Type::STR, "", "According to BIP22"},
            RPCResult{"Otherwise", RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::NUM, "version", "The preferred block version"},
                {RPCResult::Type::ARR, "rules", "specific block rules that are to be enforced",
                {
                    {RPCResult::Type::STR, "", "name of a rule the client must understand to some extent; see BIP 9 for format"},
                }},
                {RPCResult::Type::OBJ_DYN, "vbavailable", "set of pending, supported versionbit (BIP 9) softfork deployments",
                {
                    {RPCResult::Type::NUM, "rulename", "identifies the bit number as indicating acceptance and readiness for the named softfork rule"},
                }},
                {RPCResult::Type::ARR, "capabilities", "",
                {
                    {RPCResult::Type::STR, "value", "A supported feature, for example 'proposal'"},
                }},
                {RPCResult::Type::NUM, "vbrequired", "bit mask of versionbits the server requires set in submissions"},
                {RPCResult::Type::STR, "previousblockhash", "The hash of current highest block"},
                {RPCResult::Type::ARR, "transactions", "contents of non-coinbase transactions that should be included in the next block",
                {
                    {RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR_HEX, "data", "transaction data encoded in hexadecimal (byte-for-byte)"},
                        {RPCResult::Type::STR_HEX, "txid", "transaction id encoded in little-endian hexadecimal"},
                        {RPCResult::Type::STR_HEX, "hash", "hash encoded in little-endian hexadecimal (including witness data)"},
                        {RPCResult::Type::ARR, "depends", "array of numbers",
                        {
                            {RPCResult::Type::NUM, "", "transactions before this one (by 1-based index in 'transactions' list) that must be present in the final block if this one is"},
                        }},
                        {RPCResult::Type::NUM, "fee", "difference in value between transaction inputs and outputs (in satoshis); for coinbase transactions, this is a negative Number of the total collected block fees (ie, not including the block subsidy); if key is not present, fee is unknown and clients MUST NOT assume there isn't one"},
                        {RPCResult::Type::NUM, "sigops", "total SigOps cost, as counted for purposes of block limits; if key is not present, sigop cost is unknown and clients MUST NOT assume it is zero"},
                        {RPCResult::Type::NUM, "weight", "total transaction weight, as counted for purposes of block limits"},
                    }},
                }},
                {RPCResult::Type::OBJ_DYN, "coinbaseaux", "data that should be included in the coinbase's scriptSig content",
                {
                    {RPCResult::Type::STR_HEX, "key", "values must be in the coinbase (keys may be ignored)"},
                }},
                {RPCResult::Type::NUM, "coinbasevalue", "maximum allowable input to coinbase transaction, including the generation award and transaction fees (in satoshis)"},
                {RPCResult::Type::STR, "longpollid", "an id to include with a request to longpoll on an update to this template"},
                {RPCResult::Type::STR, "target", "The hash target"},
                {RPCResult::Type::NUM_TIME, "mintime", "The minimum timestamp appropriate for the next block time, expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::ARR, "mutable", "list of ways the block template may be changed",
                {
                    {RPCResult::Type::STR, "value", "A way the block template may be changed, e.g. 'time', 'transactions', 'prevblock'"},
                }},
                {RPCResult::Type::STR_HEX, "noncerange", "A range of valid nonces"},
                {RPCResult::Type::NUM, "sigoplimit", "limit of sigops in blocks"},
                {RPCResult::Type::NUM, "sizelimit", "limit of block size"},
                {RPCResult::Type::NUM, "weightlimit", /*optional=*/true, "limit of block weight"},
                {RPCResult::Type::NUM_TIME, "curtime", "current timestamp in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::STR, "bits", "compressed target of next block"},
                {RPCResult::Type::NUM, "height", "The height of the next block"},
                {RPCResult::Type::STR_HEX, "signet_challenge", /*optional=*/true, "Only on signet"},
                {RPCResult::Type::STR_HEX, "default_witness_commitment", /*optional=*/true, "a valid witness commitment for the unmodified block template"},
            }},
        },
        RPCExamples{
                    HelpExampleCli("getblocktemplate", "'{\"rules\": [\"segwit\"]}'")
            + HelpExampleRpc("getblocktemplate", "{\"rules\": [\"segwit\"]}")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);
    Mining& miner = EnsureMining(node);
    LOCK(cs_main);
    uint256 tip{CHECK_NONFATAL(miner.getTip()).value().hash};

    std::string strMode = "template";
    UniValue lpval = NullUniValue;
    std::set<std::string> setClientRules;
    if (!request.params[0].isNull())
    {
        const UniValue& oparam = request.params[0].get_obj();
        const UniValue& modeval = oparam.find_value("mode");
        if (modeval.isStr())
            strMode = modeval.get_str();
        else if (modeval.isNull())
        {
            /* Do nothing */
        }
        else
            throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid mode");
        lpval = oparam.find_value("longpollid");

        if (strMode == "proposal")
        {
            const UniValue& dataval = oparam.find_value("data");
            if (!dataval.isStr())
                throw JSONRPCError(RPC_TYPE_ERROR, "Missing data String key for proposal");

            CBlock block;
            if (!DecodeHexBlk(block, dataval.get_str()))
                throw JSONRPCError(RPC_DESERIALIZATION_ERROR, "Block decode failed");

            uint256 hash = block.GetHash();
            const CBlockIndex* pindex = chainman.m_blockman.LookupBlockIndex(hash);
            if (pindex) {
                if (pindex->IsValid(BLOCK_VALID_SCRIPTS))
                    return "duplicate";
                if (pindex->nStatus & BLOCK_FAILED_MASK)
                    return "duplicate-invalid";
                return "duplicate-inconclusive";
            }

            // testBlockValidity only supports blocks built on the current Tip
            if (block.hashPrevBlock != tip) {
                return "inconclusive-not-best-prevblk";
            }
            BlockValidationState state;
            miner.testBlockValidity(block, /*check_merkle_root=*/true, state);
            return BIP22ValidationResult(state);
        }

        const UniValue& aClientRules = oparam.find_value("rules");
        if (aClientRules.isArray()) {
            for (unsigned int i = 0; i < aClientRules.size(); ++i) {
                const UniValue& v = aClientRules[i];
                setClientRules.insert(v.get_str());
            }
        }
    }

    if (strMode != "template")
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid mode");

    if (!miner.isTestChain()) {
        const CConnman& connman = EnsureConnman(node);
        if (connman.GetNodeCount(ConnectionDirection::Both) == 0) {
            throw JSONRPCError(RPC_CLIENT_NOT_CONNECTED, PACKAGE_NAME " is not connected!");
        }

        if (miner.isInitialBlockDownload()) {
            throw JSONRPCError(RPC_CLIENT_IN_INITIAL_DOWNLOAD, PACKAGE_NAME " is in initial sync and waiting for blocks...");
        }
    }

    static unsigned int nTransactionsUpdatedLast;

    if (!lpval.isNull())
    {
        // Wait to respond until either the best block changes, OR a minute has passed and there are more transactions
        uint256 hashWatchedChain;
        unsigned int nTransactionsUpdatedLastLP;

        if (lpval.isStr())
        {
            // Format: <hashBestChain><nTransactionsUpdatedLast>
            const std::string& lpstr = lpval.get_str();

            hashWatchedChain = ParseHashV(lpstr.substr(0, 64), "longpollid");
            nTransactionsUpdatedLastLP = LocaleIndependentAtoi<int64_t>(lpstr.substr(64));
        }
        else
        {
            // NOTE: Spec does not specify behaviour for non-string longpollid, but this makes testing easier
            hashWatchedChain = tip;
            nTransactionsUpdatedLastLP = nTransactionsUpdatedLast;
        }

        // Release lock while waiting
        LEAVE_CRITICAL_SECTION(cs_main);
        {
            MillisecondsDouble checktxtime{std::chrono::minutes(1)};
            while (tip == hashWatchedChain && IsRPCRunning()) {
                tip = miner.waitTipChanged(hashWatchedChain, checktxtime).hash;
                // Timeout: Check transactions for update
                // without holding the mempool lock to avoid deadlocks
                if (miner.getTransactionsUpdated() != nTransactionsUpdatedLastLP)
                    break;
                checktxtime = std::chrono::seconds(10);
            }
        }
        ENTER_CRITICAL_SECTION(cs_main);

        tip = CHECK_NONFATAL(miner.getTip()).value().hash;

        if (!IsRPCRunning())
            throw JSONRPCError(RPC_CLIENT_NOT_CONNECTED, "Shutting down");
        // TODO: Maybe recheck connections/IBD and (if something wrong) send an expires-immediately template to stop miners?
    }

    const Consensus::Params& consensusParams = chainman.GetParams().GetConsensus();

    // GBT must be called with 'signet' set in the rules for signet chains
    if (consensusParams.signet_blocks && setClientRules.count("signet") != 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "getblocktemplate must be called with the signet rule set (call with {\"rules\": [\"segwit\", \"signet\"]})");
    }

    // GBT must be called with 'segwit' set in the rules
    if (setClientRules.count("segwit") != 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "getblocktemplate must be called with the segwit rule set (call with {\"rules\": [\"segwit\"]})");
    }

    // Update block
    static CBlockIndex* pindexPrev;
    static int64_t time_start;
    static std::unique_ptr<BlockTemplate> block_template;
    if (!pindexPrev || pindexPrev->GetBlockHash() != tip ||
        (miner.getTransactionsUpdated() != nTransactionsUpdatedLast && GetTime() - time_start > 5))
    {
        // Clear pindexPrev so future calls make a new block, despite any failures from here on
        pindexPrev = nullptr;

        // Store the pindexBest used before createNewBlock, to avoid races
        nTransactionsUpdatedLast = miner.getTransactionsUpdated();
        CBlockIndex* pindexPrevNew = chainman.m_blockman.LookupBlockIndex(tip);
        time_start = GetTime();

        // Create new block
        CScript scriptDummy = CScript() << OP_TRUE;
        block_template = miner.createNewBlock(scriptDummy);
        CHECK_NONFATAL(block_template);


        // Need to update only after we know createNewBlock succeeded
        pindexPrev = pindexPrevNew;
    }
    CHECK_NONFATAL(pindexPrev);
    CBlock block{block_template->getBlock()};

    // Update nTime
    UpdateTime(&block, consensusParams, pindexPrev);
    block.nNonce = 0;

    // NOTE: If at some point we support pre-segwit miners post-segwit-activation, this needs to take segwit support into consideration
    const bool fPreSegWit = !DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_SEGWIT);

    UniValue aCaps(UniValue::VARR); aCaps.push_back("proposal");

    UniValue transactions(UniValue::VARR);
    std::map<uint256, int64_t> setTxIndex;
    std::vector<CAmount> tx_fees{block_template->getTxFees()};
    std::vector<CAmount> tx_sigops{block_template->getTxSigops()};

    int i = 0;
    for (const auto& it : block.vtx) {
        const CTransaction& tx = *it;
        uint256 txHash = tx.GetHash();
        setTxIndex[txHash] = i++;

        if (tx.IsCoinBase())
            continue;

        UniValue entry(UniValue::VOBJ);

        entry.pushKV("data", EncodeHexTx(tx));
        entry.pushKV("txid", txHash.GetHex());
        entry.pushKV("hash", tx.GetWitnessHash().GetHex());

        UniValue deps(UniValue::VARR);
        for (const CTxIn &in : tx.vin)
        {
            if (setTxIndex.count(in.prevout.hash))
                deps.push_back(setTxIndex[in.prevout.hash]);
        }
        entry.pushKV("depends", std::move(deps));

        int index_in_template = i - 1;
        entry.pushKV("fee", tx_fees.at(index_in_template));
        int64_t nTxSigOps{tx_sigops.at(index_in_template)};
        if (fPreSegWit) {
            CHECK_NONFATAL(nTxSigOps % WITNESS_SCALE_FACTOR == 0);
            nTxSigOps /= WITNESS_SCALE_FACTOR;
        }
        entry.pushKV("sigops", nTxSigOps);
        entry.pushKV("weight", GetTransactionWeight(tx));

        transactions.push_back(std::move(entry));
    }

    UniValue aux(UniValue::VOBJ);

    arith_uint256 hashTarget = arith_uint256().SetCompact(block.nBits);

    UniValue aMutable(UniValue::VARR);
    aMutable.push_back("time");
    aMutable.push_back("transactions");
    aMutable.push_back("prevblock");

    UniValue result(UniValue::VOBJ);
    result.pushKV("capabilities", std::move(aCaps));

    UniValue aRules(UniValue::VARR);
    aRules.push_back("csv");
    if (!fPreSegWit) aRules.push_back("!segwit");
    if (consensusParams.signet_blocks) {
        // indicate to miner that they must understand signet rules
        // when attempting to mine with this template
        aRules.push_back("!signet");
    }

    UniValue vbavailable(UniValue::VOBJ);
    for (int j = 0; j < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; ++j) {
        Consensus::DeploymentPos pos = Consensus::DeploymentPos(j);
        ThresholdState state = chainman.m_versionbitscache.State(pindexPrev, consensusParams, pos);
        switch (state) {
            case ThresholdState::DEFINED:
            case ThresholdState::FAILED:
                // Not exposed to GBT at all
                break;
            case ThresholdState::LOCKED_IN:
                // Ensure bit is set in block version
                block.nVersion |= chainman.m_versionbitscache.Mask(consensusParams, pos);
                [[fallthrough]];
            case ThresholdState::STARTED:
            {
                const struct VBDeploymentInfo& vbinfo = VersionBitsDeploymentInfo[pos];
                vbavailable.pushKV(gbt_vb_name(pos), consensusParams.vDeployments[pos].bit);
                if (setClientRules.find(vbinfo.name) == setClientRules.end()) {
                    if (!vbinfo.gbt_force) {
                        // If the client doesn't support this, don't indicate it in the [default] version
                        block.nVersion &= ~chainman.m_versionbitscache.Mask(consensusParams, pos);
                    }
                }
                break;
            }
            case ThresholdState::ACTIVE:
            {
                // Add to rules only
                const struct VBDeploymentInfo& vbinfo = VersionBitsDeploymentInfo[pos];
                aRules.push_back(gbt_vb_name(pos));
                if (setClientRules.find(vbinfo.name) == setClientRules.end()) {
                    // Not supported by the client; make sure it's safe to proceed
                    if (!vbinfo.gbt_force) {
                        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Support for '%s' rule requires explicit client support", vbinfo.name));
                    }
                }
                break;
            }
        }
    }
    result.pushKV("version", block.nVersion);
    result.pushKV("rules", std::move(aRules));
    result.pushKV("vbavailable", std::move(vbavailable));
    result.pushKV("vbrequired", int(0));

    result.pushKV("previousblockhash", block.hashPrevBlock.GetHex());
    result.pushKV("transactions", std::move(transactions));
    result.pushKV("coinbaseaux", std::move(aux));
    result.pushKV("coinbasevalue", (int64_t)block.vtx[0]->vout[0].nValue);
    result.pushKV("longpollid", tip.GetHex() + ToString(nTransactionsUpdatedLast));
    result.pushKV("target", hashTarget.GetHex());
    result.pushKV("mintime", (int64_t)pindexPrev->GetMedianTimePast()+1);
    result.pushKV("mutable", std::move(aMutable));
    result.pushKV("noncerange", "00000000ffffffff");
    int64_t nSigOpLimit = MAX_BLOCK_SIGOPS_COST;
    int64_t nSizeLimit = MAX_BLOCK_SERIALIZED_SIZE;
    if (fPreSegWit) {
        CHECK_NONFATAL(nSigOpLimit % WITNESS_SCALE_FACTOR == 0);
        nSigOpLimit /= WITNESS_SCALE_FACTOR;
        CHECK_NONFATAL(nSizeLimit % WITNESS_SCALE_FACTOR == 0);
        nSizeLimit /= WITNESS_SCALE_FACTOR;
    }
    result.pushKV("sigoplimit", nSigOpLimit);
    result.pushKV("sizelimit", nSizeLimit);
    if (!fPreSegWit) {
        result.pushKV("weightlimit", (int64_t)MAX_BLOCK_WEIGHT);
    }
    result.pushKV("curtime", block.GetBlockTime());
    result.pushKV("bits", strprintf("%08x", block.nBits));
    result.pushKV("height", (int64_t)(pindexPrev->nHeight+1));

    if (consensusParams.signet_blocks) {
        result.pushKV("signet_challenge", HexStr(consensusParams.signet_challenge));
    }

    if (!block_template->getCoinbaseCommitment().empty()) {
        result.pushKV("default_witness_commitment", HexStr(block_template->getCoinbaseCommitment()));
    }

    return result;
},
    };
}